

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O0

void DumpData(PtexTexture *r,int faceid,bool dumpall)

{
  bool bVar1;
  int iVar2;
  Header *pHVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  byte in_DL;
  uint in_ESI;
  PtexReader *in_RDI;
  int c;
  int ui;
  int vi;
  bool isconst;
  int vres;
  int ures;
  Res res;
  float *pixel;
  int nchan;
  FaceInfo *f;
  PtexReader *R;
  int levels;
  int local_58;
  uint local_50;
  uint local_4c;
  int local_44;
  int local_40;
  Res local_3a;
  void *local_38;
  int local_2c;
  FaceInfo *local_28;
  uint local_14;
  byte local_d;
  uint local_c;
  PtexReader *local_8;
  
  local_d = in_DL & 1;
  local_14 = 1;
  local_c = in_ESI;
  local_8 = in_RDI;
  if ((local_d != 0) && (in_RDI != (PtexReader *)0x0)) {
    pHVar3 = Ptex::v2_2::PtexReader::header(in_RDI);
    local_14 = (uint)pHVar3->nlevels;
  }
  iVar2 = (*(local_8->super_PtexTexture)._vptr_PtexTexture[0x10])(local_8,(ulong)local_c);
  local_28 = (FaceInfo *)CONCAT44(extraout_var,iVar2);
  local_2c = (*(local_8->super_PtexTexture)._vptr_PtexTexture[0xb])();
  local_38 = malloc((long)local_2c << 2);
  local_3a = local_28->res;
  while( true ) {
    bVar1 = false;
    if (local_14 != 0) {
      bVar1 = false;
      if ('\0' < local_3a.ulog2) {
        bVar1 = '\0' < local_3a.vlog2;
      }
    }
    if (!bVar1) break;
    local_40 = Ptex::v2_2::Res::u(&local_3a);
    local_44 = Ptex::v2_2::Res::v(&local_3a);
    poVar4 = std::operator<<((ostream *)&std::cout,"  data (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_40);
    poVar4 = std::operator<<(poVar4," x ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_44);
    std::operator<<(poVar4,")");
    bVar1 = Ptex::v2_2::FaceInfo::isConstant(local_28);
    if (bVar1) {
      local_44 = 1;
      local_40 = 1;
    }
    if (local_40 != 1 || local_44 != 1) {
      std::operator<<((ostream *)&std::cout,":");
    }
    else {
      std::operator<<((ostream *)&std::cout,", const: ");
    }
    for (local_4c = 0; (int)local_4c < local_44; local_4c = local_4c + 1) {
      for (local_50 = 0; (int)local_50 < local_40; local_50 = local_50 + 1) {
        if (local_40 != 1 || local_44 != 1) {
          poVar4 = std::operator<<((ostream *)&std::cout,"\n    (");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_50);
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_4c);
          std::operator<<(poVar4,"): ");
        }
        (*(local_8->super_PtexTexture)._vptr_PtexTexture[0x16])
                  (local_8,(ulong)local_c,(ulong)local_50,(ulong)local_4c,local_38,0,local_2c,
                   (uint)(ushort)local_3a);
        for (local_58 = 0; local_58 < local_2c; local_58 = local_58 + 1) {
          printf(" %.3f",(double)*(float *)((long)local_38 + (long)local_58 * 4));
        }
      }
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_3a.vlog2 = local_3a.vlog2 + -1;
    local_3a.ulog2 = local_3a.ulog2 + -1;
    local_14 = local_14 - 1;
  }
  free(local_38);
  return;
}

Assistant:

void DumpData(PtexTexture* r, int faceid, bool dumpall)
{
    int levels = 1;
    if (dumpall) {
        PtexReader* R = static_cast<PtexReader*> (r);
        if (R) levels = R->header().nlevels;
    }

    const Ptex::FaceInfo& f = r->getFaceInfo(faceid);
    int nchan = r->numChannels();
    float* pixel = (float*) malloc(sizeof(float)*nchan);
    Ptex::Res res = f.res;
    while (levels && res.ulog2 >= 1 && res.vlog2 >= 1) {
        int ures = res.u(), vres = res.v();
        std::cout << "  data (" << ures << " x " << vres << ")";
        if (f.isConstant()) { ures = vres = 1; }
        bool isconst = (ures == 1 && vres == 1);
        if (isconst) std::cout << ", const: ";
        else std::cout << ":";
        for (int vi = 0; vi < vres; vi++) {
            for (int ui = 0; ui < ures; ui++) {
                if (!isconst) std::cout << "\n    (" << ui << ", " << vi << "): ";
                r->getPixel(faceid, ui, vi, pixel, 0, nchan, res);
                for (int c=0; c < nchan; c++) {
                    printf(" %.3f", pixel[c]);
                }
            }
        }
        std::cout << std::endl;
        res.ulog2--;
        res.vlog2--;
        levels--;
    }
    free(pixel);
}